

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O2

Simulation * MetaSim::Simulation::getInstance(void)

{
  Simulation *this;
  
  if (instance_ == (Simulation *)0x0) {
    this = (Simulation *)operator_new(0x80);
    Simulation(this);
    instance_ = this;
  }
  return instance_;
}

Assistant:

Simulation& Simulation::getInstance()
    {
        if (instance_ == 0) instance_ = new Simulation();
                
        return *instance_;
    }